

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O3

Hop_Man_t * Abc_NtkHaigReconstruct(Hop_Man_t *p)

{
  void *pvVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  Hop_Man_t *p_00;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Hop_Obj_t *pHVar8;
  ulong uVar9;
  long *plVar10;
  ulong uVar11;
  long *plVar12;
  
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)pVVar6->pArray[lVar5] + 8) = 0;
      lVar5 = lVar5 + 1;
      pVVar6 = p->vObjs;
    } while (lVar5 < pVVar6->nSize);
  }
  p_00 = Hop_ManStart();
  iVar4 = p->nCreated;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  iVar3 = 8;
  if (6 < iVar4 - 1U) {
    iVar3 = iVar4;
  }
  pVVar6->nCap = iVar3;
  if (iVar3 == 0) {
    p_00->vObjs = pVVar6;
    pHVar8 = p_00->pConst1;
    ppvVar7 = (void **)malloc(0x80);
    pVVar6->pArray = ppvVar7;
    pVVar6->nCap = 0x10;
  }
  else {
    ppvVar7 = (void **)malloc((long)iVar3 << 3);
    pVVar6->pArray = ppvVar7;
    p_00->vObjs = pVVar6;
    pHVar8 = p_00->pConst1;
  }
  pVVar6->nSize = 1;
  *ppvVar7 = pHVar8;
  p->pConst1->field_1 = (anon_union_8_2_6d2434d6_for_Hop_Obj_t__2)p_00->pConst1;
  pVVar6 = p->vPis;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar5];
      pHVar8 = Hop_ObjCreatePi(p_00);
      *(Hop_Obj_t **)((long)pvVar1 + 8) = pHVar8;
      lVar5 = lVar5 + 1;
      pVVar6 = p->vPis;
    } while (lVar5 < pVVar6->nSize);
  }
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      plVar12 = (long *)pVVar6->pArray[lVar5];
      if ((*(uint *)(plVar12 + 4) & 6) == 4) {
        plVar10 = (long *)(plVar12[2] & 0xfffffffffffffffe);
        uVar9 = plVar10[1];
        if (uVar9 == 0) goto LAB_0087e7f3;
        plVar2 = (long *)*plVar10;
        if (plVar2 != (long *)0x0) {
          if ((long *)*plVar2 != plVar2) goto LAB_0087e812;
          uVar9 = (ulong)((*(uint *)(plVar2 + 4) ^ *(uint *)(plVar10 + 4)) >> 3 & 1) ^ plVar2[1];
        }
        plVar10 = (long *)(plVar12[3] & 0xfffffffffffffffe);
        uVar11 = plVar10[1];
        if (uVar11 == 0) goto LAB_0087e7f3;
        plVar2 = (long *)*plVar10;
        if (plVar2 != (long *)0x0) {
          if ((long *)*plVar2 != plVar2) goto LAB_0087e812;
          uVar11 = (ulong)((*(uint *)(plVar2 + 4) ^ *(uint *)(plVar10 + 4)) >> 3 & 1) ^ plVar2[1];
        }
        pHVar8 = Hop_And(p_00,(Hop_Obj_t *)((uint)plVar12[2] & 1 ^ uVar9),
                         (Hop_Obj_t *)((uint)plVar12[3] & 1 ^ uVar11));
        plVar12[1] = (long)pHVar8;
        if (*plVar12 != 0) {
          *(ulong *)((ulong)pHVar8 & 0xfffffffffffffffe) =
               *(ulong *)(*plVar12 + 8) & 0xfffffffffffffffe;
        }
      }
      lVar5 = lVar5 + 1;
      pVVar6 = p->vObjs;
    } while (lVar5 < pVVar6->nSize);
  }
  pVVar6 = p->vPos;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      uVar9 = *(ulong *)((long)pVVar6->pArray[lVar5] + 0x10);
      plVar12 = (long *)(uVar9 & 0xfffffffffffffffe);
      uVar11 = plVar12[1];
      if (uVar11 == 0) {
LAB_0087e7f3:
        __assert_fail("pObj->pNext != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                      ,0xbd,"Hop_Obj_t *Hop_ObjReprHop(Hop_Obj_t *)");
      }
      plVar10 = (long *)*plVar12;
      if (plVar10 != (long *)0x0) {
        if ((long *)*plVar10 != plVar10) {
LAB_0087e812:
          __assert_fail("pRepr->pData == pRepr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcHaig.c"
                        ,0xc1,"Hop_Obj_t *Hop_ObjReprHop(Hop_Obj_t *)");
        }
        uVar11 = (ulong)((*(uint *)(plVar10 + 4) ^ *(uint *)(plVar12 + 4)) >> 3 & 1) ^ plVar10[1];
      }
      Hop_ObjCreatePo(p_00,(Hop_Obj_t *)((uint)uVar9 & 1 ^ uVar11));
      lVar5 = lVar5 + 1;
      pVVar6 = p->vPos;
    } while (lVar5 < pVVar6->nSize);
  }
  iVar4 = Hop_ManCheck(p_00);
  if (iVar4 == 0) {
    puts("Abc_NtkHaigReconstruct: Check for History AIG has failed.");
    Hop_ManStop(p_00);
    p_00 = (Hop_Man_t *)0x0;
  }
  return p_00;
}

Assistant:

Hop_Man_t * Abc_NtkHaigReconstruct( Hop_Man_t * p )
{ 
    Hop_Man_t * pNew;
    Hop_Obj_t * pObj;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
        pObj->pNext = NULL;
    // start the HOP package
    pNew = Hop_ManStart();
    pNew->vObjs = Vec_PtrAlloc( p->nCreated );
    Vec_PtrPush( pNew->vObjs, Hop_ManConst1(pNew) );
    // map the constant node
    Hop_ManConst1(p)->pNext = Hop_ManConst1(pNew);
    // map the CIs
    Hop_ManForEachPi( p, pObj, i )
        pObj->pNext = Hop_ObjCreatePi(pNew);
    // map the internal nodes
    Vec_PtrForEachEntry( Hop_Obj_t *, p->vObjs, pObj, i )
    {
        if ( !Hop_ObjIsNode(pObj) )
            continue;
        pObj->pNext = Hop_And( pNew, Hop_ObjChild0Hop(pObj), Hop_ObjChild1Hop(pObj) );
//        assert( !Hop_IsComplement(pObj->pNext) );
        if ( Hop_ManConst1(pNew) == Hop_Regular(pObj->pNext) )
            Counter++;
        if ( pObj->pData ) // member of the class
            Hop_Regular(pObj->pNext)->pData = Hop_Regular(((Hop_Obj_t *)pObj->pData)->pNext);
    }
//    printf( " Counter = %d.\n", Counter );
    // transfer the POs
    Hop_ManForEachPo( p, pObj, i )
        Hop_ObjCreatePo( pNew, Hop_ObjChild0Hop(pObj) );
    // check the new manager
    if ( !Hop_ManCheck(pNew) )
    {
        printf( "Abc_NtkHaigReconstruct: Check for History AIG has failed.\n" );
        Hop_ManStop(pNew);
        return NULL;
    }
    return pNew;
}